

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_lightning.cpp
# Opt level: O3

void __thiscall DLightningThinker::Serialize(DLightningThinker *this,FArchive *arc)

{
  FArchive *pFVar1;
  WORD *w;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->Stopped);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->NextLightningFlash);
  FArchive::operator<<(pFVar1,(DWORD *)&this->LightningFlashCount);
  w = (WORD *)this->LightningLightLevels;
  iVar3 = numsectors;
  if (arc->m_Loading != false) {
    if (w != (WORD *)0x0) {
      operator_delete__(w);
    }
    iVar3 = numsectors;
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)numsectors) {
      uVar2 = (long)numsectors * 2;
    }
    w = (WORD *)operator_new__(uVar2);
    this->LightningLightLevels = (short *)w;
  }
  if (0 < iVar3) {
    uVar4 = iVar3 + 1;
    do {
      FArchive::operator<<(arc,w);
      w = w + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void DLightningThinker::Serialize (FArchive &arc)
{
	int i;
	short *lights;

	Super::Serialize (arc);

	arc << Stopped << NextLightningFlash << LightningFlashCount;

	if (arc.IsLoading ())
	{
		if (LightningLightLevels != NULL)
		{
			delete[] LightningLightLevels;
		}
		LightningLightLevels = new short[numsectors];
	}
	lights = LightningLightLevels;
	for (i = numsectors; i > 0; ++lights, --i)
	{
		arc << *lights;
	}
}